

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O0

size_t EBML_FillBufferID(uint8_t *Buffer,size_t BufSize,fourcc_t Id)

{
  size_t FinalHeadSize;
  size_t i;
  fourcc_t Id_local;
  size_t BufSize_local;
  uint8_t *Buffer_local;
  
  Buffer_local = (uint8_t *)GetIdLength(Id);
  if (BufSize < Buffer_local) {
    Buffer_local = (uint8_t *)0x0;
  }
  else {
    for (FinalHeadSize = 0; FinalHeadSize < Buffer_local; FinalHeadSize = FinalHeadSize + 1) {
      Buffer[(long)(Buffer_local + (-1 - FinalHeadSize))] =
           (uint8_t)(Id >> ((byte)(FinalHeadSize << 3) & 0x1f));
    }
  }
  return (size_t)Buffer_local;
}

Assistant:

size_t EBML_FillBufferID(uint8_t *Buffer, size_t BufSize, fourcc_t Id)
{
    size_t i,FinalHeadSize = GetIdLength(Id);
    if (BufSize < FinalHeadSize)
        return 0;
    for (i=0;i<FinalHeadSize;++i)
        Buffer[FinalHeadSize-i-1] = (uint8_t)(Id >> (i<<3));
    return FinalHeadSize;
}